

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLFormulasLinker.cpp
# Opt level: O2

size_t __thiscall
COLLADASaxFWL::FormulasLinker::getNewParamIndex
          (FormulasLinker *this,Formula *formula,String *parameterName,bool *found)

{
  size_t sVar1;
  __type _Var2;
  bool bVar3;
  size_t sVar4;
  
  sVar1 = (formula->mNewParams).super_ArrayPrimitiveType<COLLADAFW::FormulaNewParam_*>.mCount;
  sVar4 = 0;
  do {
    if (sVar1 == sVar4) {
      bVar3 = false;
      sVar4 = 0;
LAB_007d6159:
      *found = bVar3;
      return sVar4;
    }
    _Var2 = std::operator==(&(formula->mNewParams).
                             super_ArrayPrimitiveType<COLLADAFW::FormulaNewParam_*>.mData[sVar4]->
                             mName,parameterName);
    if (_Var2) {
      bVar3 = true;
      goto LAB_007d6159;
    }
    sVar4 = sVar4 + 1;
  } while( true );
}

Assistant:

size_t FormulasLinker::getNewParamIndex(const COLLADAFW::Formula* formula, const String& parameterName, bool &found)
	{
		const COLLADAFW::FormulaNewParamPointerArray& newParams = formula->getNewParams();
		for ( size_t i = 0, count = newParams.getCount(); i < count; ++i)
		{
			const COLLADAFW::FormulaNewParam* newParam = newParams[i];
			if ( newParam->getName() == parameterName )
			{
				found = true;
				return i;
			}
		}
		found = false;
		return 0;
	}